

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_object_type_e qpdf_oh_get_type_code(qpdf_data qpdf,qpdf_oh oh)

{
  qpdf_object_type_e qVar1;
  anon_class_1_0_00000001 local_61;
  function<qpdf_object_type_e_(QPDFObjectHandle_&)> local_60;
  qpdf_object_type_e local_3c;
  function<qpdf_object_type_e_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_3c = ot_uninitialized;
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<qpdf_object_type_e>(&local_38,&local_3c);
  std::function<qpdf_object_type_e(QPDFObjectHandle&)>::function<qpdf_oh_get_type_code::__0,void>
            ((function<qpdf_object_type_e(QPDFObjectHandle&)> *)&local_60,&local_61);
  qVar1 = do_with_oh<qpdf_object_type_e>(qpdf,oh,&local_38,&local_60);
  std::function<qpdf_object_type_e_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<qpdf_object_type_e_()>::~function(&local_38);
  return qVar1;
}

Assistant:

qpdf_object_type_e
qpdf_oh_get_type_code(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_object_type_e>(
        qpdf, oh, return_T<qpdf_object_type_e>(ot_uninitialized), [](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_type_code");
            return o.getTypeCode();
        });
}